

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<float> * __thiscall
VW::config::typed_option<float>::default_value(typed_option<float> *this,float value)

{
  __shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<float,float&>((float *)&local_20);
  std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_default_value).super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

typed_option& default_value(T value)
  {
    m_default_value = std::make_shared<T>(value);
    return *this;
  }